

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.c
# Opt level: O0

void time_to_scetime(time_t *time,SceDateTime *sce)

{
  __uint32_t _Var1;
  tm *ptVar2;
  tm *tmp;
  SceDateTime *sce_local;
  time_t *time_local;
  
  ptVar2 = localtime(time);
  _Var1 = __uint32_identity(ptVar2->tm_sec);
  sce->second = (uint16_t)_Var1;
  _Var1 = __uint32_identity(ptVar2->tm_min);
  sce->minute = (uint16_t)_Var1;
  _Var1 = __uint32_identity(ptVar2->tm_hour);
  sce->hour = (uint16_t)_Var1;
  _Var1 = __uint32_identity(ptVar2->tm_mday);
  sce->day = (uint16_t)_Var1;
  _Var1 = __uint32_identity(ptVar2->tm_mon + 1);
  sce->month = (uint16_t)_Var1;
  _Var1 = __uint32_identity(ptVar2->tm_year + 0x76c);
  sce->year = (uint16_t)_Var1;
  _Var1 = __uint32_identity(0);
  sce->microsecond = _Var1;
  return;
}

Assistant:

static void time_to_scetime(const time_t *time, SceDateTime *sce) {
  struct tm *tmp;
  tmp = localtime(time);
  sce->second = htole32(tmp->tm_sec);
  sce->minute = htole32(tmp->tm_min);
  sce->hour = htole32(tmp->tm_hour);
  sce->day = htole32(tmp->tm_mday);
  sce->month = htole32(tmp->tm_mon + 1);
  sce->year = htole32(tmp->tm_year + 1900);
  sce->microsecond = htole32(0);
}